

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.h
# Opt level: O1

void __thiscall AST::FloatLit::FloatLit(FloatLit *this,string *value)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  undefined8 uVar3;
  double dVar4;
  char *local_30;
  
  (this->super_Expr).super_Stmt._vptr_Stmt = (_func_int **)&PTR__Stmt_00116c20;
  __nptr = (value->_M_dataplus)._M_p;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  dVar4 = strtod(__nptr,&local_30);
  if (local_30 == __nptr) {
    uVar3 = std::__throw_invalid_argument("stod");
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    _Unwind_Resume(uVar3);
  }
  if (*piVar2 != 0) {
    if (*piVar2 != 0x22) goto LAB_0010f675;
    dVar4 = (double)std::__throw_out_of_range("stod");
  }
  *piVar2 = iVar1;
LAB_0010f675:
  this->m_value = dVar4;
  return;
}

Assistant:

explicit FloatLit(const std::string &value) : m_value(std::stod(value)) { }